

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::writeDataToTexture
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level)

{
  int iVar1;
  int iVar2;
  GLenum err;
  ostream *poVar3;
  TestError *this_00;
  uchar *ptr;
  GLubyte *data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecData;
  int local_60;
  GLint texSize;
  GLint depth;
  GLint height;
  GLint width;
  TransferFormat local_4c;
  TransferFormat transferFormat;
  GLint level_local;
  GLuint *texture_local;
  GLint format_local;
  GLint target_local;
  Functions *gl_local;
  SparseTextureCommitmentTestCase *this_local;
  
  poVar3 = std::operator<<((ostream *)&this->field_0x88,"Fill texture [level: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,level);
  std::operator<<(poVar3,"] - ");
  if ((this->mState).levels + -1 < level) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
               ,0x797);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  _height = (this->mState).format;
  local_4c = glu::getTransferFormat(_height);
  SparseTextureUtils::getTextureLevelSize(target,&this->mState,level,&depth,&texSize,&local_60);
  if (((0 < depth) && (0 < texSize)) && ((this->mState).minDepth <= local_60)) {
    iVar1 = depth * texSize * local_60;
    iVar2 = tcu::TextureFormat::getPixelSize(&(this->mState).format);
    vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = iVar1 * iVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,
               (long)vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    ::deMemset(ptr,level * 0x10 + 0x10,
               (long)vecData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    gl4cts::Texture::SubImage
              (gl,target,level,0,0,0,depth,texSize,local_60,local_4c.format,local_4c.dataType,ptr);
    err = (*gl->getError)();
    glu::checkError(err,"SubImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                    ,0x7ac);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  }
  return true;
}

Assistant:

bool SparseTextureCommitmentTestCase::writeDataToTexture(const Functions& gl, GLint target, GLint format,
														 GLuint& texture, GLint level)
{
	DE_UNREF(format);
	DE_UNREF(texture);

	mLog << "Fill texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (width > 0 && height > 0 && depth >= mState.minDepth)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecData;
		vecData.resize(texSize);
		GLubyte* data = vecData.data();

		deMemset(data, 16 + 16 * level, texSize);

		Texture::SubImage(gl, target, level, 0, 0, 0, width, height, depth, transferFormat.format,
						  transferFormat.dataType, (GLvoid*)data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "SubImage");
	}

	return true;
}